

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int CountTotalFuncs(Lexer *lexer)

{
  undefined4 local_18;
  undefined4 local_14;
  Token tok;
  int total;
  Lexer *lexer_local;
  
  local_14 = 0;
  local_18 = GetNextToken(lexer);
  while (local_18 != UNDEFINED) {
    if (local_18 == FUNC) {
      local_14 = local_14 + 1;
    }
    local_18 = GetNextToken(lexer);
  }
  DestroyLexer(lexer);
  return local_14;
}

Assistant:

int CountTotalFuncs(Lexer* lexer){	
	int total = 0;
	Token tok = GetNextToken(lexer);

	while (tok != UNDEFINED){
		if (tok == FUNC) total++;
		tok = GetNextToken(lexer);
	}
	DestroyLexer(lexer);
	return total;
}